

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.h
# Opt level: O2

int __thiscall axl::io::psx::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  
  iVar2 = (this->super_File).super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h
  ;
  sVar3 = getSockAddrSize((sockaddr *)CONCAT44(in_register_00000034,__fd));
  iVar2 = ::bind(iVar2,(sockaddr *)CONCAT44(in_register_00000034,__fd),(socklen_t)sVar3);
  bVar1 = err::complete((uint)(iVar2 != -1));
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool
	bind(const sockaddr* addr) {
		int result = ::bind(m_h, addr, getSockAddrSize(addr));
		return err::complete(result != -1);
	}